

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::viper::Viper::GetWheelAppliedTorque
          (ChVector<double> *__return_storage_ptr__,Viper *this,ViperWheelID id)

{
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &(((this->m_wheels)._M_elems[id].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChBody::GetAppliedTorque();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Viper::GetWheelAppliedTorque(ViperWheelID id) const {
    return m_wheels[id]->GetBody()->GetAppliedTorque();
}